

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryRequirementsTests.cpp
# Opt level: O0

bool vkt::memory::anon_unknown_0::imageUsageMatchesFormatFeatures
               (VkImageUsageFlags usage,VkFormatFeatureFlags featureFlags)

{
  VkFormatFeatureFlags featureFlags_local;
  VkImageUsageFlags usage_local;
  
  if (((usage & 4) == 0) || ((featureFlags & 1) == 0)) {
    if (((usage & 8) == 0) || ((featureFlags & 2) == 0)) {
      if (((usage & 0x90) == 0) || ((featureFlags & 0x80) == 0)) {
        if (((usage & 0x20) == 0) || ((featureFlags & 0x200) == 0)) {
          featureFlags_local._3_1_ = false;
        }
        else {
          featureFlags_local._3_1_ = true;
        }
      }
      else {
        featureFlags_local._3_1_ = true;
      }
    }
    else {
      featureFlags_local._3_1_ = true;
    }
  }
  else {
    featureFlags_local._3_1_ = true;
  }
  return featureFlags_local._3_1_;
}

Assistant:

bool imageUsageMatchesFormatFeatures (const VkImageUsageFlags usage, const VkFormatFeatureFlags featureFlags)
{
	if ((usage & VK_IMAGE_USAGE_SAMPLED_BIT) && (featureFlags & VK_FORMAT_FEATURE_SAMPLED_IMAGE_BIT))
		return true;
	if ((usage & VK_IMAGE_USAGE_STORAGE_BIT) && (featureFlags & VK_FORMAT_FEATURE_STORAGE_IMAGE_BIT))
		return true;
	if ((usage & (VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_INPUT_ATTACHMENT_BIT)) && (featureFlags & VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT))
		return true;
	if ((usage & VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT) && (featureFlags & VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT))
		return true;

	return false;
}